

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_filter_xz.c
# Opt level: O0

void test_write_filter_xz(void)

{
  undefined8 uVar1;
  int iVar2;
  wchar_t wVar3;
  void *buff_00;
  void *__s;
  archive *paVar4;
  char *pcVar5;
  la_ssize_t lVar6;
  la_int64_t lVar7;
  uint local_5c;
  int r;
  int i;
  size_t used2;
  size_t used1;
  char path [16];
  size_t datasize;
  size_t buffsize;
  char *data;
  char *buff;
  archive *a;
  archive_entry *ae;
  
  buff_00 = malloc(2000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                   ,L'.',(uint)(buff_00 != (void *)0x0),"NULL != (buff = malloc(buffsize))",
                   (void *)0x0);
  if (buff_00 != (void *)0x0) {
    path[8] = '\x10';
    path[9] = '\'';
    path[10] = '\0';
    path[0xb] = '\0';
    path[0xc] = '\0';
    path[0xd] = '\0';
    path[0xe] = '\0';
    path[0xf] = '\0';
    __s = malloc(10000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                     ,L'3',(uint)(__s != (void *)0x0),"NULL != (data = malloc(datasize))",
                     (void *)0x0);
    if (__s == (void *)0x0) {
      free(buff_00);
    }
    else {
      memset(__s,0,path._8_8_);
      paVar4 = archive_write_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                       ,L'=',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                       (void *)0x0);
      iVar2 = archive_write_set_format_ustar(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                          ,L'>',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_ustar(a)",
                          paVar4);
      iVar2 = archive_write_add_filter_xz(paVar4);
      if (iVar2 == -0x1e) {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                       ,L'A');
        test_skipping("xz writing not supported on this platform");
        iVar2 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'B',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
        free(buff_00);
        free(__s);
      }
      else {
        iVar2 = archive_write_set_bytes_per_block(paVar4,10);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'H',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_bytes_per_block(a, 10)",paVar4);
        iVar2 = archive_filter_code(paVar4,0);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'I',6,"ARCHIVE_FILTER_XZ",(long)iVar2,"archive_filter_code(a, 0)",
                            (void *)0x0);
        pcVar5 = archive_filter_name(paVar4,0);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                   ,L'J',"xz","\"xz\"",pcVar5,"archive_filter_name(a, 0)",(void *)0x0,L'\0');
        iVar2 = archive_write_open_memory(paVar4,buff_00,2000000,&used2);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'K',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_open_memory(a, buff, buffsize, &used1)",paVar4);
        iVar2 = archive_filter_code(paVar4,0);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'L',6,"ARCHIVE_FILTER_XZ",(long)iVar2,"archive_filter_code(a, 0)",
                            (void *)0x0);
        pcVar5 = archive_filter_name(paVar4,0);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                   ,L'M',"xz","\"xz\"",pcVar5,"archive_filter_name(a, 0)",(void *)0x0,L'\0');
        a = (archive *)archive_entry_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                         ,L'N',(uint)((archive_entry *)a != (archive_entry *)0x0),
                         "(ae = archive_entry_new()) != NULL",(void *)0x0);
        archive_entry_set_filetype((archive_entry *)a,0x8000);
        archive_entry_set_size((archive_entry *)a,path._8_8_);
        for (local_5c = 0; (int)local_5c < 100; local_5c = local_5c + 1) {
          snprintf((char *)&used1,0x10,"file%03d");
          archive_entry_copy_pathname((archive_entry *)a,(char *)&used1);
          iVar2 = archive_write_header(paVar4,(archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                              ,L'T',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar4)
          ;
          uVar1 = path._8_8_;
          lVar6 = archive_write_data(paVar4,__s,path._8_8_);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                           ,L'V',(uint)(uVar1 == lVar6),
                           "datasize == (size_t)archive_write_data(a, data, datasize)",paVar4);
        }
        archive_entry_free((archive_entry *)a);
        iVar2 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'Y',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar4);
        iVar2 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'Z',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
        paVar4 = archive_read_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                         ,L'\\',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                         (void *)0x0);
        iVar2 = archive_read_support_format_all(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L']',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",
                            paVar4);
        iVar2 = archive_read_support_filter_xz(paVar4);
        if (iVar2 == -0x14) {
          skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                         ,L'`');
          test_skipping(
                       "Can\'t verify xz writing by reading back; xz reading not fully supported on this platform"
                       );
        }
        else {
          iVar2 = archive_read_support_filter_all(paVar4);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                              ,L'd',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)",
                              paVar4);
          iVar2 = archive_read_open_memory(paVar4,buff_00,used2);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                              ,L'f',0,"ARCHIVE_OK",(long)iVar2,
                              "archive_read_open_memory(a, buff, used1)",paVar4);
          for (local_5c = 0; (int)local_5c < 100; local_5c = local_5c + 1) {
            snprintf((char *)&used1,0x10,"file%03d",(ulong)local_5c);
            iVar2 = archive_read_next_header(paVar4,(archive_entry **)&a);
            wVar3 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                                        ,L'j',0,"ARCHIVE_OK",(long)iVar2,
                                        "archive_read_next_header(a, &ae)",(void *)0x0);
            if (wVar3 == L'\0') break;
            pcVar5 = archive_entry_pathname((archive_entry *)a);
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                       ,L'l',(char *)&used1,"path",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,
                       L'\0');
            iVar2 = (int)path._8_8_;
            lVar7 = archive_entry_size((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                                ,L'm',(long)iVar2,"(int)datasize",lVar7,"archive_entry_size(ae)",
                                (void *)0x0);
          }
          iVar2 = archive_read_close(paVar4);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                              ,L'o',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",paVar4);
        }
        iVar2 = archive_read_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'q',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
        paVar4 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                         ,L'w',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                         (void *)0x0);
        iVar2 = archive_write_set_format_ustar(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'x',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_ustar(a)",
                            paVar4);
        iVar2 = archive_write_set_bytes_per_block(paVar4,10);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'z',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_bytes_per_block(a, 10)",paVar4);
        iVar2 = archive_write_add_filter_xz(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'{',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_xz(a)",paVar4
                           );
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"nonexistent-option","0");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'}',-0x19,"ARCHIVE_FAILED",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"nonexistent-option\", \"0\")"
                            ,paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","abc");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'\x7f',-0x19,"ARCHIVE_FAILED",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"compression-level\", \"abc\")"
                            ,paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","99");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'\x81',-0x19,"ARCHIVE_FAILED",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"compression-level\", \"99\")"
                            ,paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","9");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'\x83',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"compression-level\", \"9\")"
                            ,paVar4);
        iVar2 = archive_write_open_memory(paVar4,buff_00,2000000,(size_t *)&r);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'\x84',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_open_memory(a, buff, buffsize, &used2)",paVar4);
        for (local_5c = 0; (int)local_5c < 100; local_5c = local_5c + 1) {
          snprintf((char *)&used1,0x10,"file%03d",(ulong)local_5c);
          a = (archive *)archive_entry_new();
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                           ,L'\x87',(uint)((archive_entry *)a != (archive_entry *)0x0),
                           "(ae = archive_entry_new()) != NULL",(void *)0x0);
          archive_entry_copy_pathname((archive_entry *)a,(char *)&used1);
          archive_entry_set_size((archive_entry *)a,path._8_8_);
          archive_entry_set_filetype((archive_entry *)a,0x8000);
          iVar2 = archive_write_header(paVar4,(archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                              ,L'\x8b',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",
                              paVar4);
          uVar1 = path._8_8_;
          lVar6 = archive_write_data(paVar4,__s,path._8_8_);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                           ,L'\x8c',(uint)(uVar1 == lVar6),
                           "datasize == (size_t)archive_write_data(a, data, datasize)",paVar4);
          archive_entry_free((archive_entry *)a);
        }
        iVar2 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'\x8f',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar4);
        iVar2 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'\x90',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0)
        ;
        paVar4 = archive_read_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                         ,L'\x9a',(uint)(paVar4 != (archive *)0x0),
                         "(a = archive_read_new()) != NULL",(void *)0x0);
        iVar2 = archive_read_support_format_all(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'\x9b',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)"
                            ,paVar4);
        iVar2 = archive_read_support_filter_xz(paVar4);
        if (iVar2 == -0x14) {
          skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                         ,L'\x9e');
          test_skipping("xz reading not fully supported on this platform");
        }
        else {
          iVar2 = archive_read_support_filter_all(paVar4);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                              ,L'¡',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)"
                              ,paVar4);
          iVar2 = archive_read_open_memory(paVar4,buff_00,_r);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                              ,L'£',0,"ARCHIVE_OK",(long)iVar2,
                              "archive_read_open_memory(a, buff, used2)",paVar4);
          for (local_5c = 0; (int)local_5c < 100; local_5c = local_5c + 1) {
            snprintf((char *)&used1,0x10,"file%03d");
            failure("Trying to read %s",&used1);
            iVar2 = archive_read_next_header(paVar4,(archive_entry **)&a);
            wVar3 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                                        ,L'¨',0,"ARCHIVE_OK",(long)iVar2,
                                        "archive_read_next_header(a, &ae)",paVar4);
            if (wVar3 == L'\0') break;
            pcVar5 = archive_entry_pathname((archive_entry *)a);
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                       ,L'ª',(char *)&used1,"path",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,
                       L'\0');
            iVar2 = (int)path._8_8_;
            lVar7 = archive_entry_size((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                                ,L'«',(long)iVar2,"(int)datasize",lVar7,"archive_entry_size(ae)",
                                (void *)0x0);
          }
          iVar2 = archive_read_close(paVar4);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                              ,L'­',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",paVar4);
        }
        iVar2 = archive_read_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'¯',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
        paVar4 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                         ,L'´',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        iVar2 = archive_write_set_format_ustar(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'µ',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_ustar(a)",
                            paVar4);
        iVar2 = archive_write_set_bytes_per_block(paVar4,10);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'·',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_bytes_per_block(a, 10)",paVar4);
        iVar2 = archive_write_add_filter_xz(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'¸',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_xz(a)",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","0");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'º',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"compression-level\", \"0\")"
                            ,paVar4);
        iVar2 = archive_write_open_memory(paVar4,buff_00,2000000,(size_t *)&r);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'»',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_open_memory(a, buff, buffsize, &used2)",paVar4);
        for (local_5c = 0; (int)local_5c < 100; local_5c = local_5c + 1) {
          snprintf((char *)&used1,0x10,"file%03d",(ulong)local_5c);
          a = (archive *)archive_entry_new();
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                           ,L'¾',(uint)((archive_entry *)a != (archive_entry *)0x0),
                           "(ae = archive_entry_new()) != NULL",(void *)0x0);
          archive_entry_copy_pathname((archive_entry *)a,(char *)&used1);
          archive_entry_set_size((archive_entry *)a,path._8_8_);
          archive_entry_set_filetype((archive_entry *)a,0x8000);
          iVar2 = archive_write_header(paVar4,(archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                              ,L'Â',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar4
                             );
          failure("Writing file %s",&used1);
          uVar1 = path._8_8_;
          lVar6 = archive_write_data(paVar4,__s,path._8_8_);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                              ,L'Å',uVar1,"datasize",lVar6,
                              "(size_t)archive_write_data(a, data, datasize)",paVar4);
          archive_entry_free((archive_entry *)a);
        }
        iVar2 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'È',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar4);
        iVar2 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'É',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
        paVar4 = archive_read_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                         ,L'Ô',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                         (void *)0x0);
        iVar2 = archive_read_support_format_all(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'Õ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",
                            paVar4);
        iVar2 = archive_read_support_filter_all(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'Ö',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)",
                            paVar4);
        iVar2 = archive_read_support_filter_xz(paVar4);
        if (iVar2 == -0x14) {
          skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                         ,L'Ù');
          test_skipping("xz reading not fully supported on this platform");
        }
        else {
          iVar2 = archive_read_open_memory(paVar4,buff_00,_r);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                              ,L'Ü',0,"ARCHIVE_OK",(long)iVar2,
                              "archive_read_open_memory(a, buff, used2)",paVar4);
          for (local_5c = 0; (int)local_5c < 100; local_5c = local_5c + 1) {
            snprintf((char *)&used1,0x10,"file%03d",(ulong)local_5c);
            iVar2 = archive_read_next_header(paVar4,(archive_entry **)&a);
            wVar3 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                                        ,L'à',0,"ARCHIVE_OK",(long)iVar2,
                                        "archive_read_next_header(a, &ae)",(void *)0x0);
            if (wVar3 == L'\0') break;
            pcVar5 = archive_entry_pathname((archive_entry *)a);
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                       ,L'â',(char *)&used1,"path",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,
                       L'\0');
            iVar2 = (int)path._8_8_;
            lVar7 = archive_entry_size((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                                ,L'ã',(long)iVar2,"(int)datasize",lVar7,"archive_entry_size(ae)",
                                (void *)0x0);
          }
          iVar2 = archive_read_close(paVar4);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                              ,L'å',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",paVar4);
        }
        iVar2 = archive_read_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'ç',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
        paVar4 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                         ,L'í',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        iVar2 = archive_write_add_filter_xz(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'î',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_xz(a)",
                            paVar4);
        iVar2 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'ï',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
        paVar4 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                         ,L'ñ',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        iVar2 = archive_write_add_filter_xz(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'ò',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_xz(a)",
                            paVar4);
        iVar2 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'ó',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",(void *)0x0);
        iVar2 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'ô',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
        paVar4 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                         ,L'ö',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        iVar2 = archive_write_set_format_ustar(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'÷',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_ustar(a)",
                            paVar4);
        iVar2 = archive_write_add_filter_xz(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'ø',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_xz(a)",
                            paVar4);
        iVar2 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'ù',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",(void *)0x0);
        iVar2 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'ú',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
        paVar4 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                         ,L'ü',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        iVar2 = archive_write_set_format_ustar(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'ý',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_ustar(a)",
                            paVar4);
        iVar2 = archive_write_add_filter_xz(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'þ',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_xz(a)",
                            paVar4);
        iVar2 = archive_write_open_memory(paVar4,buff_00,2000000,(size_t *)&r);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'ÿ',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_open_memory(a, buff, buffsize, &used2)",paVar4);
        iVar2 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'Ā',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",(void *)0x0);
        iVar2 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_xz.c"
                            ,L'ā',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
        free(__s);
        free(buff_00);
      }
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_write_filter_xz)
{
	struct archive_entry *ae;
	struct archive* a;
	char *buff, *data;
	size_t buffsize, datasize;
	char path[16];
	size_t used1, used2;
	int i, r;

	buffsize = 2000000;
	assert(NULL != (buff = malloc(buffsize)));
	if (buff == NULL)
		return;

	datasize = 10000;
	assert(NULL != (data = malloc(datasize)));
	if (data == NULL) {
		free(buff);
		return;
	}
	memset(data, 0, datasize);

	/*
	 * Write a 100 files and read them all back.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	r = archive_write_add_filter_xz(a);
	if (r == ARCHIVE_FATAL) {
		skipping("xz writing not supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		free(data);
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualInt(ARCHIVE_FILTER_XZ, archive_filter_code(a, 0));
	assertEqualString("xz", archive_filter_name(a, 0));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used1));
	assertEqualInt(ARCHIVE_FILTER_XZ, archive_filter_code(a, 0));
	assertEqualString("xz", archive_filter_name(a, 0));
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, datasize);
	for (i = 0; i < 100; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		archive_entry_copy_pathname(ae, path);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize
		    == (size_t)archive_write_data(a, data, datasize));
	}
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	r = archive_read_support_filter_xz(a);
	if (r == ARCHIVE_WARN) {
		skipping("Can't verify xz writing by reading back;"
		    " xz reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used1));
		for (i = 0; i < 100; i++) {
			snprintf(path, sizeof(path), "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat the cycle again, this time setting some compression
	 * options.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_xz(a));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "nonexistent-option", "0"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "abc"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "99"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "9"));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < 100; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize == (size_t)archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Curiously, this test fails; the test data above compresses
	 * better at default compression than at level 9. */
	/*
	failure("compression-level=9 wrote %d bytes, default wrote %d bytes",
	    (int)used2, (int)used1);
	assert(used2 < used1);
	*/

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	r = archive_read_support_filter_xz(a);
	if (r == ARCHIVE_WARN) {
		skipping("xz reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used2));
		for (i = 0; i < 100; i++) {
			snprintf(path, sizeof(path), "file%03d", i);
			failure("Trying to read %s", path);
			if (!assertEqualIntA(a, ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat again, with much lower compression.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_xz(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "0"));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < 100; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		failure("Writing file %s", path);
		assertEqualIntA(a, datasize,
		    (size_t)archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* I would like to assert that compression-level=0 results in
	 * larger data than the default compression, but that's not true
	 * for all versions of liblzma. */
	/*
	failure("Compression-level=0 wrote %d bytes; default wrote %d bytes",
	    (int)used2, (int)used1);
	assert(used2 > used1);
	*/

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	r = archive_read_support_filter_xz(a);
	if (r == ARCHIVE_WARN) {
		skipping("xz reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used2));
		for (i = 0; i < 100; i++) {
			snprintf(path, sizeof(path), "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Test various premature shutdown scenarios to make sure we
	 * don't crash or leak memory.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_xz(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_xz(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_xz(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_xz(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used2));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Clean up.
	 */
	free(data);
	free(buff);
}